

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

string * __thiscall
glcts::TestCaseBase::getGLSLExtDirective_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,ExtensionType type,ExtensionName name,
          ExtensionBehavior behavior)

{
  bool bVar1;
  ostream *poVar2;
  stringstream local_278 [8];
  stringstream str;
  ostream local_268;
  allocator<char> local_ed;
  allocator<char> local_ec;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  char *local_50;
  char *behavior_str;
  char *name_str;
  char *type_str;
  allocator<char> local_25;
  ExtensionBehavior local_24;
  ExtensionName local_20;
  ExtensionBehavior behavior_local;
  ExtensionName name_local;
  ExtensionType type_local;
  TestCaseBase *this_local;
  
  local_24 = behavior;
  local_20 = name;
  behavior_local = type;
  _name_local = this;
  this_local = (TestCaseBase *)__return_storage_ptr__;
  if (((type == EXTENSIONTYPE_NONE) && (name != EXTENSIONNAME_GEOMETRY_POINT_SIZE)) &&
     (name != EXTENSIONNAME_TESSELLATION_POINT_SIZE)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_25);
    std::allocator<char>::~allocator(&local_25);
  }
  else {
    name_str = (char *)0x0;
    behavior_str = (char *)0x0;
    local_50 = (char *)0x0;
    if (name == EXTENSIONNAME_SHADER_IMAGE_ATOMIC) {
      behavior_local = EXTENSIONBEHAVIOR_ENABLE;
    }
    if (name == EXTENSIONNAME_TESSELLATION_POINT_SIZE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"GL_OES_tessellation_point_size",&local_71);
      bVar1 = isExtensionSupported(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      if (bVar1) {
        behavior_local = EXTENSIONBEHAVIOR_ENABLE;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"GL_EXT_tessellation_point_size",&local_99);
        bVar1 = isExtensionSupported(this,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",&local_9a);
          std::allocator<char>::~allocator(&local_9a);
          return __return_storage_ptr__;
        }
        behavior_local = EXTENSIONBEHAVIOR_WARN;
      }
    }
    if (local_20 == EXTENSIONNAME_GEOMETRY_POINT_SIZE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"GL_OES_geometry_point_size",&local_c1);
      bVar1 = isExtensionSupported(this,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      if (bVar1) {
        behavior_local = EXTENSIONBEHAVIOR_ENABLE;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"GL_EXT_geometry_point_size",&local_e9);
        bVar1 = isExtensionSupported(this,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",&local_ea);
          std::allocator<char>::~allocator(&local_ea);
          return __return_storage_ptr__;
        }
        behavior_local = EXTENSIONBEHAVIOR_WARN;
      }
    }
    if (behavior_local == EXTENSIONBEHAVIOR_WARN) {
      name_str = "EXT_";
    }
    else {
      if (behavior_local != EXTENSIONBEHAVIOR_ENABLE) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"#error unknown extension type\n",&local_eb);
        std::allocator<char>::~allocator(&local_eb);
        return __return_storage_ptr__;
      }
      name_str = "OES_";
    }
    switch(local_20) {
    case EXTENSIONNAME_SHADER_IMAGE_ATOMIC:
      behavior_str = "shader_image_atomic";
      break;
    case EXTENSIONNAME_SHADER_IO_BLOCKS:
      behavior_str = "shader_io_blocks";
      break;
    case EXTENSIONNAME_GEOMETRY_SHADER:
      behavior_str = "geometry_shader";
      break;
    case EXTENSIONNAME_GEOMETRY_POINT_SIZE:
      behavior_str = "geometry_point_size";
      break;
    case EXTENSIONNAME_TESSELLATION_SHADER:
      behavior_str = "tessellation_shader";
      break;
    case EXTENSIONNAME_TESSELLATION_POINT_SIZE:
      behavior_str = "tessellation_point_size";
      break;
    case EXTENSIONNAME_TEXTURE_BUFFER:
      behavior_str = "texture_buffer";
      break;
    case EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY:
      behavior_str = "texture_cube_map_array";
      break;
    case EXTENSIONNAME_GPU_SHADER5:
      behavior_str = "gpu_shader5";
      break;
    case EXTENSIONNAME_VIEWPORT_ARRAY:
      behavior_str = "viewport_array";
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"#error unknown extension name\n",&local_ec);
      std::allocator<char>::~allocator(&local_ec);
      return __return_storage_ptr__;
    }
    switch(local_24) {
    case EXTENSIONBEHAVIOR_DISABLE:
      local_50 = "disable";
      break;
    case EXTENSIONBEHAVIOR_WARN:
      local_50 = "warn";
      break;
    case EXTENSIONBEHAVIOR_ENABLE:
      local_50 = "enable";
      break;
    case EXTENSIONBEHAVIOR_REQUIRE:
      local_50 = "require";
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"#error unknown extension behavior",&local_ed);
      std::allocator<char>::~allocator(&local_ed);
      return __return_storage_ptr__;
    }
    std::__cxx11::stringstream::stringstream(local_278);
    poVar2 = std::operator<<(&local_268,"#extension GL_");
    poVar2 = std::operator<<(poVar2,name_str);
    poVar2 = std::operator<<(poVar2,behavior_str);
    poVar2 = std::operator<<(poVar2," : ");
    std::operator<<(poVar2,local_50);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_278);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::getGLSLExtDirective(ExtensionType type, ExtensionName name, ExtensionBehavior behavior)
{
	if (type == EXTENSIONTYPE_NONE && name != EXTENSIONNAME_GEOMETRY_POINT_SIZE &&
		name != EXTENSIONNAME_TESSELLATION_POINT_SIZE)
	{
		return "";
	}

	const char* type_str	 = NULL;
	const char* name_str	 = NULL;
	const char* behavior_str = NULL;

	if (name == EXTENSIONNAME_SHADER_IMAGE_ATOMIC)
	{
		// There is no EXT version of shader_image_atomic; use OES
		type = EXTENSIONTYPE_OES;
	}

	if (name == EXTENSIONNAME_TESSELLATION_POINT_SIZE)
	{
		// there is no core version of tessellation_point_size, use OES or EXT
		if (isExtensionSupported("GL_OES_tessellation_point_size"))
		{
			type = EXTENSIONTYPE_OES;
		}
		else if (isExtensionSupported("GL_EXT_tessellation_point_size"))
		{
			type = EXTENSIONTYPE_EXT;
		}
		else
		{
			return "";
		}
	}

	if (name == EXTENSIONNAME_GEOMETRY_POINT_SIZE)
	{
		// there is no core version of geometry_point_size, use OES or EXT
		if (isExtensionSupported("GL_OES_geometry_point_size"))
		{
			type = EXTENSIONTYPE_OES;
		}
		else if (isExtensionSupported("GL_EXT_geometry_point_size"))
		{
			type = EXTENSIONTYPE_EXT;
		}
		else
		{
			return "";
		}
	}

	switch (type)
	{
	case EXTENSIONTYPE_EXT:
		type_str = "EXT_";
		break;
	case EXTENSIONTYPE_OES:
		type_str = "OES_";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension type\n";
	}

	switch (name)
	{
	case EXTENSIONNAME_SHADER_IMAGE_ATOMIC:
		name_str = "shader_image_atomic";
		break;
	case EXTENSIONNAME_SHADER_IO_BLOCKS:
		name_str = "shader_io_blocks";
		break;
	case EXTENSIONNAME_GEOMETRY_SHADER:
		name_str = "geometry_shader";
		break;
	case EXTENSIONNAME_GEOMETRY_POINT_SIZE:
		name_str = "geometry_point_size";
		break;
	case EXTENSIONNAME_TESSELLATION_SHADER:
		name_str = "tessellation_shader";
		break;
	case EXTENSIONNAME_TESSELLATION_POINT_SIZE:
		name_str = "tessellation_point_size";
		break;
	case EXTENSIONNAME_TEXTURE_BUFFER:
		name_str = "texture_buffer";
		break;
	case EXTENSIONNAME_TEXTURE_CUBE_MAP_ARRAY:
		name_str = "texture_cube_map_array";
		break;
	case EXTENSIONNAME_GPU_SHADER5:
		name_str = "gpu_shader5";
		break;
	case EXTENSIONNAME_VIEWPORT_ARRAY:
		name_str = "viewport_array";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension name\n";
	}

	switch (behavior)
	{
	case EXTENSIONBEHAVIOR_DISABLE:
		behavior_str = "disable";
		break;
	case EXTENSIONBEHAVIOR_WARN:
		behavior_str = "warn";
		break;
	case EXTENSIONBEHAVIOR_ENABLE:
		behavior_str = "enable";
		break;
	case EXTENSIONBEHAVIOR_REQUIRE:
		behavior_str = "require";
		break;
	default:
		DE_ASSERT(0);
		return "#error unknown extension behavior";
	}

	std::stringstream str;
	str << "#extension GL_" << type_str << name_str << " : " << behavior_str;
	return str.str();
}